

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_entityrelationtask.cc
# Opt level: O2

void EntityRelationTask::decode_tag(v_array<char> tag,char *type,int *id1,int *id2)

{
  int iVar1;
  ulong uVar2;
  string s1;
  string s2;
  
  s1._M_dataplus._M_p = (pointer)&s1.field_2;
  s1._M_string_length = 0;
  s1.field_2._M_local_buf[0] = '\0';
  s2._M_dataplus._M_p = (pointer)&s2.field_2;
  s2._M_string_length = 0;
  s2.field_2._M_local_buf[0] = '\0';
  *type = *tag._begin;
  for (uVar2 = 2;
      ((uVar2 < (ulong)((long)tag._end - (long)tag._begin) && (tag._begin[uVar2] != '\0')) &&
      (tag._begin[uVar2] != '_')); uVar2 = uVar2 + 1) {
    std::__cxx11::string::push_back((char)&s1);
  }
  iVar1 = atoi(s1._M_dataplus._M_p);
  *id1 = iVar1;
  while (((uVar2 = uVar2 + 1, uVar2 < (ulong)((long)tag._end - (long)tag._begin) &&
          (tag._begin[uVar2] != '\0')) && (tag._begin[uVar2] != '_'))) {
    std::__cxx11::string::push_back((char)&s2);
  }
  iVar1 = atoi(s2._M_dataplus._M_p);
  *id2 = iVar1;
  std::__cxx11::string::~string((string *)&s2);
  std::__cxx11::string::~string((string *)&s1);
  return;
}

Assistant:

void decode_tag(v_array<char> tag, char& type, int& id1, int& id2)
{
  string s1;
  string s2;
  type = tag[0];
  size_t idx = 2;
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s1.push_back(tag[idx]);
    idx++;
  }
  id1 = atoi(s1.c_str());
  idx++;
  assert(type == 'R');
  while (idx < tag.size() && tag[idx] != '_' && tag[idx] != '\0')
  {
    s2.push_back(tag[idx]);
    idx++;
  }
  id2 = atoi(s2.c_str());
}